

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLCache.c
# Opt level: O2

DdNode * cuddHashTableLookup1(DdHashTable *hash,DdNode *f)

{
  ptrint *ppVar1;
  int *piVar2;
  int iVar3;
  DdNode *pDVar4;
  int iVar5;
  DdHashItem *pDVar6;
  DdHashItem **ppDVar7;
  DdHashItem **ppDVar8;
  DdHashItem *pDVar9;
  
  iVar3 = *(int *)(((ulong)f & 0xfffffffffffffffe) + 0x20);
  iVar5 = hash->shift;
  ppDVar8 = hash->bucket;
  pDVar6 = (DdHashItem *)(DdHashItem **)0x0;
  pDVar9 = (DdHashItem *)
           (ppDVar8 + ((((uint)f & 1) + iVar3 * 2) * 0x7c45abd6 >> ((byte)iVar5 & 0x1f)));
  do {
    ppDVar7 = &pDVar6->next;
    pDVar9 = pDVar9->next;
    if (pDVar9 == (DdHashItem *)0x0) {
      return (DdNode *)0x0;
    }
    pDVar6 = pDVar9;
  } while (pDVar9->key[0] != f);
  pDVar4 = pDVar9->value;
  ppVar1 = &pDVar9->count;
  *ppVar1 = *ppVar1 + -1;
  if (*ppVar1 != 0) {
    return pDVar4;
  }
  piVar2 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
  *piVar2 = *piVar2 + -1;
  ppDVar8 = ppDVar8 + ((((uint)f & 1) + iVar3 * 2) * 0x7c45abd6 >> ((byte)iVar5 & 0x1f));
  if (ppDVar7 != (DdHashItem **)0x0) {
    ppDVar8 = ppDVar7;
  }
  *ppDVar8 = pDVar9->next;
  pDVar9->next = hash->nextFree;
  hash->nextFree = pDVar9;
  hash->size = hash->size - 1;
  return pDVar4;
}

Assistant:

DdNode *
cuddHashTableLookup1(
  DdHashTable * hash,
  DdNode * f)
{
    unsigned int posn;
    DdHashItem *item, *prev;

#ifdef DD_DEBUG
    assert(hash->keysize == 1);
#endif

    posn = ddLCHash2(cuddF2L(f),cuddF2L(f),hash->shift);
    item = hash->bucket[posn];
    prev = NULL;

    while (item != NULL) {
        DdNodePtr *key = item->key;
        if (f == key[0]) {
            DdNode *value = item->value;
            cuddSatDec(item->count);
            if (item->count == 0) {
                cuddDeref(value);
                if (prev == NULL) {
                    hash->bucket[posn] = item->next;
                } else {
                    prev->next = item->next;
                }
                item->next = hash->nextFree;
                hash->nextFree = item;
                hash->size--;
            }
            return(value);
        }
        prev = item;
        item = item->next;
    }
    return(NULL);

}